

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSymStr.c
# Opt level: O2

void Sim_SymmsStructCompute(Abc_Ntk_t *pNtk,Vec_Ptr_t *vMatrs,Vec_Ptr_t *vSuppFun)

{
  long lVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  int *pMap;
  Vec_Ptr_t *pVVar6;
  Vec_Ptr_t *vNodesPi;
  Vec_Ptr_t *vNodesPi_00;
  Vec_Ptr_t *vNodesOther;
  void *pvVar7;
  long *plVar8;
  Extra_BitMat_t *p;
  uint uVar9;
  ulong uVar10;
  int *pMap_00;
  int *piVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  Vec_Ptr_t *p_00;
  long lVar17;
  
  if (0xfff5 < pNtk->vCis->nSize) {
    __assert_fail("Abc_NtkCiNum(pNtk) + 10 < (1<<16)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sim/simSymStr.c"
                  ,0x43,"void Sim_SymmsStructCompute(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  pVVar3 = Sim_ComputeStrSupp(pNtk);
  pNtk->vSupps = pVVar3;
  for (iVar14 = 0; iVar2 = pNtk->vCis->nSize, iVar14 < iVar2; iVar14 = iVar14 + 1) {
    pAVar4 = Abc_NtkCi(pNtk,iVar14);
    pAVar5 = (Abc_Obj_t *)Vec_IntAlloc(0);
    (pAVar4->field_6).pCopy = pAVar5;
  }
  uVar9 = pNtk->vObjs->nSize;
  pMap = (int *)malloc((long)(int)uVar9 << 2);
  uVar13 = 0;
  uVar10 = 0;
  if (0 < (int)uVar9) {
    uVar10 = (ulong)uVar9;
  }
  for (; uVar10 != uVar13; uVar13 = uVar13 + 1) {
    pMap[uVar13] = -1;
  }
  for (iVar14 = 0; iVar14 < iVar2; iVar14 = iVar14 + 1) {
    pAVar4 = Abc_NtkCi(pNtk,iVar14);
    pMap[pAVar4->Id] = iVar14;
    iVar2 = pNtk->vCis->nSize;
  }
  pVVar3 = Abc_NtkDfs(pNtk,0);
  for (iVar14 = 0; iVar14 < pVVar3->nSize; iVar14 = iVar14 + 1) {
    pVVar6 = pVVar3;
    pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(pVVar3,iVar14);
    iVar2 = (int)pVVar6;
    pVVar6 = Vec_PtrAlloc(iVar2);
    vNodesPi = Vec_PtrAlloc(iVar2);
    vNodesPi_00 = Vec_PtrAlloc(iVar2);
    vNodesOther = Vec_PtrAlloc(iVar2);
    Sim_SymmsBalanceCollect_rec(pAVar4,pVVar6);
    iVar2 = pVVar6->nSize;
    iVar15 = 0;
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    for (; iVar2 != iVar15; iVar15 = iVar15 + 1) {
      pvVar7 = Vec_PtrEntry(pVVar6,iVar15);
      uVar9 = *(uint *)(((ulong)pvVar7 & 0xfffffffffffffffe) + 0x14) & 0xf;
      if ((uVar9 == 5) || (p_00 = vNodesOther, uVar9 == 2)) {
        p_00 = vNodesPi;
        if (((ulong)pvVar7 & 1) == 0) {
          p_00 = vNodesPi_00;
        }
      }
      Vec_PtrPush(p_00,pvVar7);
    }
    pAVar5 = (Abc_Obj_t *)Vec_IntAlloc(10);
    Sim_SymmsAppendFromGroup(pNtk,vNodesPi,vNodesOther,(Vec_Int_t *)pAVar5,pMap);
    Sim_SymmsAppendFromGroup(pNtk,vNodesPi_00,vNodesOther,(Vec_Int_t *)pAVar5,pMap);
    uVar9 = vNodesOther->nSize;
    if (vNodesOther->nSize < 1) {
      uVar9 = 0;
    }
    for (piVar11 = (int *)0x0; piVar11 != (int *)(ulong)uVar9; piVar11 = (int *)((long)piVar11 + 1))
    {
      lVar1 = *(long *)(((ulong)vNodesOther->pArray[(long)piVar11] & 0xfffffffffffffffe) + 0x40);
      iVar2 = *(int *)(lVar1 + 4);
      if (iVar2 != 0) {
        pMap_00 = piVar11;
        for (lVar17 = 0; lVar17 < iVar2; lVar17 = lVar17 + 1) {
          uVar12 = *(uint *)(*(long *)(lVar1 + 8) + lVar17 * 4);
          iVar15 = Sim_SymmsIsCompatibleWithNodes(pNtk,uVar12,vNodesOther,pMap_00);
          if (iVar15 != 0) {
            iVar15 = Sim_SymmsIsCompatibleWithGroup(uVar12,vNodesPi,pMap);
            if (iVar15 != 0) {
              iVar15 = Sim_SymmsIsCompatibleWithGroup(uVar12,vNodesPi_00,pMap);
              if (iVar15 != 0) {
                Vec_IntPushUnique((Vec_Int_t *)pAVar5,uVar12);
                iVar2 = *(int *)(lVar1 + 4);
              }
            }
          }
        }
      }
    }
    Vec_PtrFree(pVVar6);
    Vec_PtrFree(vNodesPi);
    Vec_PtrFree(vNodesPi_00);
    Vec_PtrFree(vNodesOther);
    (pAVar4->field_6).pCopy = pAVar5;
  }
  iVar14 = 0;
  do {
    if (pNtk->vCos->nSize <= iVar14) {
      Sim_UtilInfoFree(pNtk->vSupps);
      pNtk->vSupps = (Vec_Ptr_t *)0x0;
      for (iVar14 = 0; iVar14 < pNtk->vCis->nSize; iVar14 = iVar14 + 1) {
        pAVar4 = Abc_NtkCi(pNtk,iVar14);
        Vec_IntFree((Vec_Int_t *)(pAVar4->field_6).pCopy);
      }
      for (iVar14 = 0; iVar14 < pVVar3->nSize; iVar14 = iVar14 + 1) {
        pvVar7 = Vec_PtrEntry(pVVar3,iVar14);
        Vec_IntFree(*(Vec_Int_t **)((long)pvVar7 + 0x40));
      }
      Vec_PtrFree(pVVar3);
      free(pMap);
      return;
    }
    plVar8 = (long *)Vec_PtrEntry(pNtk->vCos,iVar14);
    uVar10 = *(ulong *)(*(long *)(*(long *)(*plVar8 + 0x20) + 8) + (long)*(int *)plVar8[4] * 8);
    uVar9 = *(uint *)(uVar10 + 0x14) & 0xf;
    if ((uVar9 != 2) && (uVar9 != 5)) {
      if (**(int **)(uVar10 & 0xfffffffffffffffe) != 3) {
        __assert_fail("Abc_NtkIsStrash(Abc_ObjRegular(pNode)->pNtk)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                      ,0x18e,"int Abc_AigNodeIsConst(Abc_Obj_t *)");
      }
      if ((*(uint *)((long)(uVar10 & 0xfffffffffffffffe) + 0x14) & 0xf) != 1) {
        p = (Extra_BitMat_t *)Vec_PtrEntry(vMatrs,iVar14);
        lVar1 = *(long *)(uVar10 + 0x40);
        pvVar7 = Vec_PtrEntry(vSuppFun,iVar14);
        iVar2 = Extra_BitMatrixReadSize(p);
        iVar15 = 0;
        if (iVar2 < 1) {
          iVar2 = 0;
        }
        for (; iVar2 != iVar15; iVar15 = iVar15 + 1) {
          Extra_BitMatrixInsert1(p,iVar15,iVar15);
        }
        for (lVar17 = 0; lVar17 < *(int *)(lVar1 + 4); lVar17 = lVar17 + 1) {
          uVar9 = *(uint *)(*(long *)(lVar1 + 8) + lVar17 * 4);
          uVar12 = 1 << ((byte)uVar9 & 0x1f) &
                   *(uint *)((long)pvVar7 + (ulong)(uVar9 >> 3 & 0x1ffc));
          uVar16 = 1 << ((byte)(uVar9 >> 0x10) & 0x1f) &
                   *(uint *)((long)pvVar7 + (ulong)(uVar9 >> 0x15) * 4);
          if ((uVar12 != 0) != (uVar16 != 0)) {
            __assert_fail("Sim_HasBit(pSupport, Ind1) == Sim_HasBit(pSupport, Ind2)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sim/simSymStr.c"
                          ,0x1c5,
                          "void Sim_SymmsTransferToMatrix(Extra_BitMat_t *, Vec_Int_t *, unsigned int *)"
                         );
          }
          if ((uVar12 != 0) && (uVar16 != 0)) {
            Extra_BitMatrixInsert1(p,uVar9 & 0xffff,uVar9 >> 0x10);
            Extra_BitMatrixInsert2(p,uVar9 & 0xffff,uVar9 >> 0x10);
          }
        }
      }
    }
    iVar14 = iVar14 + 1;
  } while( true );
}

Assistant:

void Sim_SymmsStructCompute( Abc_Ntk_t * pNtk, Vec_Ptr_t * vMatrs, Vec_Ptr_t * vSuppFun )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pTemp;
    int * pMap, i;

    assert( Abc_NtkCiNum(pNtk) + 10 < (1<<16) );

    // get the structural support
    pNtk->vSupps = Sim_ComputeStrSupp( pNtk );
    // set elementary info for the CIs
    Abc_NtkForEachCi( pNtk, pTemp, i )
        SIM_SET_SYMMS( pTemp, Vec_IntAlloc(0) );
    // create the map of CI ids into their numbers
    pMap = Sim_SymmsCreateMap( pNtk );
    // collect the nodes in the TFI cone of this output
    vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pTemp, i )
    {
//        if ( Abc_NodeIsConst(pTemp) )
//            continue;
        Sim_SymmsStructComputeOne( pNtk, pTemp, pMap );
    }
    // collect the results for the COs;
    Abc_NtkForEachCo( pNtk, pTemp, i )
    {
//printf( "Output %d:\n", i );
        pTemp = Abc_ObjFanin0(pTemp);
        if ( Abc_ObjIsCi(pTemp) || Abc_AigNodeIsConst(pTemp) )
            continue;
        Sim_SymmsTransferToMatrix( (Extra_BitMat_t *)Vec_PtrEntry(vMatrs, i), SIM_READ_SYMMS(pTemp), (unsigned *)Vec_PtrEntry(vSuppFun, i) );
    }
    // clean the intermediate results
    Sim_UtilInfoFree( pNtk->vSupps );
    pNtk->vSupps = NULL;
    Abc_NtkForEachCi( pNtk, pTemp, i )
        Vec_IntFree( SIM_READ_SYMMS(pTemp) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pTemp, i )
//        if ( !Abc_NodeIsConst(pTemp) )
            Vec_IntFree( SIM_READ_SYMMS(pTemp) );
    Vec_PtrFree( vNodes );
    ABC_FREE( pMap );
}